

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int loader_load_from_file(char *tag,loader_path *paths,size_t size,void **handle)

{
  int iVar1;
  plugin ppVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  plugin p;
  void **in_stack_00001000;
  size_t in_stack_00001008;
  loader_path *in_stack_00001010;
  loader_impl in_stack_00001018;
  plugin in_stack_00001020;
  plugin_manager in_stack_00001028;
  char *in_stack_ffffffffffffffb8;
  int local_4;
  
  iVar1 = loader_initialize();
  if (iVar1 == 1) {
    local_4 = 1;
  }
  else {
    ppVar2 = loader_get_impl_plugin(in_stack_ffffffffffffffb8);
    if (ppVar2 == (plugin)0x0) {
      log_write_impl_va("metacall",0x154,"loader_load_from_file",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                        ,3,"Tried to load %zu file(s) from non existent loader (%s): %s",in_RDX,
                        in_RDI,in_RSI);
      local_4 = 1;
    }
    else {
      plugin_impl(ppVar2);
      local_4 = loader_impl_load_from_file
                          (in_stack_00001028,in_stack_00001020,in_stack_00001018,in_stack_00001010,
                           in_stack_00001008,in_stack_00001000);
    }
  }
  return local_4;
}

Assistant:

int loader_load_from_file(const loader_tag tag, const loader_path paths[], size_t size, void **handle)
{
	if (loader_initialize() == 1)
	{
		return 1;
	}

	plugin p = loader_get_impl_plugin(tag);

	if (p == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Tried to load %" PRIuS " file(s) from non existent loader (%s): %s", size, tag, paths[0]);
		return 1;
	}

	/* TODO: Disable logs here until log is completely thread safe and async signal safe */
	/* log_write("metacall", LOG_LEVEL_DEBUG, "Loading %" PRIuS " file(s) (%s) from path(s): %s ...", size, tag, paths[0]); */

	return loader_impl_load_from_file(&loader_manager, p, plugin_impl_type(p, loader_impl), paths, size, handle);
}